

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QList<QTableWidgetItem_*> * __thiscall
QTableWidget::selectedItems(QList<QTableWidgetItem_*> *__return_storage_ptr__,QTableWidget *this)

{
  QTableWidgetPrivate *this_00;
  char cVar1;
  QTableModel *this_01;
  QTableWidgetItem *t;
  QModelIndexList *__range1;
  QModelIndex *index;
  QModelIndex *index_00;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableWidgetPrivate **)
             &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
              super_QFrame.super_QWidget.field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::selectionModel((QAbstractItemView *)this);
  QItemSelectionModel::selectedIndexes();
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QTableWidgetItem **)0x0;
  index_00 = local_48.ptr;
  for (lVar2 = local_48.size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    cVar1 = (**(code **)(*(long *)&(this->super_QTableView).super_QAbstractItemView.
                                   super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x2c0))
                      (this,index_00);
    if (cVar1 == '\0') {
      this_01 = QTableWidgetPrivate::tableModel(this_00);
      t = QTableModel::item(this_01,index_00);
      if (t != (QTableWidgetItem *)0x0) {
        QList<QTableWidgetItem_*>::append(__return_storage_ptr__,t);
      }
    }
    index_00 = index_00 + 1;
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetItem*> QTableWidget::selectedItems() const
{
    Q_D(const QTableWidget);
    const QModelIndexList indexes = selectionModel()->selectedIndexes();
    QList<QTableWidgetItem*> items;
    for (const auto &index : indexes) {
        if (isIndexHidden(index))
            continue;
        QTableWidgetItem *item = d->tableModel()->item(index);
        if (item)
            items.append(item);
    }
    return items;
}